

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          LogicalType params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  pointer pcVar1;
  LogicalType params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  string *value;
  undefined8 in_stack_fffffffffffffe98;
  undefined1 *puVar2;
  element_type *in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb8 [16];
  pointer pEVar3;
  pointer in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed8 [16];
  undefined1 *puVar4;
  _Alloc_hider in_stack_fffffffffffffef0;
  undefined1 local_108 [16];
  string local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  undefined1 local_c0 [40];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ExceptionFormatValue local_68;
  
  pEVar3 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88[0] = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pEVar3,
             &((values->
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               )._M_impl.super__Vector_impl_data._M_finish)->type + (long)pEVar3);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            (&local_68,(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  pEVar3 = (pointer)&stack0xfffffffffffffed8;
  pcVar1 = (param->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffec8,pcVar1,pcVar1 + param->_M_string_length);
  LogicalType::LogicalType((LogicalType *)(local_d8 + 0x18),(LogicalType *)params);
  puVar2 = &stack0xfffffffffffffeb8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffea8,*(long *)params_1,
             (long)&((params_1->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params_1);
  LogicalType::LogicalType((LogicalType *)local_d8,(LogicalType *)params_2._M_dataplus._M_p);
  local_f8._0_8_ = local_e8;
  ::std::__cxx11::string::_M_construct<char*>
            (local_f8,*(long *)params_2._M_string_length,
             *(long *)(params_2._M_string_length + 8) + *(long *)params_2._M_string_length);
  puVar4 = local_108;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee8,*(long *)params_2.field_2._M_allocated_capacity,
             *(long *)(params_2.field_2._M_allocated_capacity + 8) +
             *(long *)params_2.field_2._M_allocated_capacity);
  local_c0._24_8_ = local_98;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_c0 + 0x18),*(long *)params_2.field_2._8_8_,
             *(long *)(params_2.field_2._8_8_ + 8) + *(long *)params_2.field_2._8_8_);
  params_2_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffee8;
  params_2_00._0_8_ = local_f8;
  params_2_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 0x18);
  params_3_00._M_string_length = (size_type)__return_storage_ptr__;
  params_3_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe98;
  params_3_00.field_2._M_allocated_capacity = (size_type)puVar2;
  params_3_00.field_2._8_8_ = in_stack_fffffffffffffeb0;
  params_4_00.field_2._M_allocated_capacity = (size_type)pEVar3;
  params_4_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffeb8._0_8_;
  params_4_00._M_string_length = in_stack_fffffffffffffeb8._8_8_;
  params_4_00.field_2._8_8_ = in_stack_fffffffffffffed0;
  params_5_00.field_2._M_allocated_capacity = (size_type)puVar4;
  params_5_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffed8._0_8_;
  params_5_00._M_string_length = in_stack_fffffffffffffed8._8_8_;
  params_5_00.field_2._8_8_ = in_stack_fffffffffffffef0._M_p;
  ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &stack0xfffffffffffffec8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d8 + 0x18),
             (LogicalType *)&stack0xfffffffffffffea8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             params_2_00,params_3_00,params_4_00,params_5_00);
  if ((undefined1 *)local_c0._24_8_ != local_98) {
    operator_delete((void *)local_c0._24_8_);
  }
  if (puVar4 != local_108) {
    operator_delete(puVar4);
  }
  if ((undefined1 *)local_f8._0_8_ != local_e8) {
    operator_delete((void *)local_f8._0_8_);
  }
  LogicalType::~LogicalType((LogicalType *)local_d8);
  if (puVar2 != &stack0xfffffffffffffeb8) {
    operator_delete(puVar2);
  }
  LogicalType::~LogicalType((LogicalType *)(local_d8 + 0x18));
  if (pEVar3 != (pointer)&stack0xfffffffffffffed8) {
    operator_delete(pEVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}